

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O1

string * __thiscall
SchemaConverter::_add_rule
          (string *__return_storage_ptr__,SchemaConverter *this,string *name,string *rule)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  size_t sVar2;
  long lVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  int iVar6;
  uint __val;
  uint uVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  long *plVar10;
  ulong uVar11;
  size_type *psVar12;
  ulong uVar13;
  _Rb_tree_header *p_Var14;
  uint uVar15;
  bool bVar16;
  string esc_name;
  string __str;
  key_type local_f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_d0;
  key_type local_c8;
  _Base_ptr local_a8;
  long *local_a0 [2];
  long local_90 [2];
  key_type local_80;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  string *local_38;
  
  paVar1 = &local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  __first._M_current = (name->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            (&local_f0,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + name->_M_string_length),&INVALID_RULE_CHARS_RE_abi_cxx11_,"-",1
             ,0);
  local_d0 = &this->_rules;
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_d0->_M_t,&local_f0);
  p_Var14 = &(this->_rules)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar8._M_node != p_Var14) {
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_d0,&local_f0);
    sVar2 = pmVar9->_M_string_length;
    if (sVar2 != rule->_M_string_length) {
LAB_0020229e:
      local_40 = local_90;
      uVar15 = 0;
      local_a8 = &p_Var14->_M_header;
      local_38 = __return_storage_ptr__;
      do {
        __val = uVar15;
        p_Var4 = local_a8;
        uVar13 = (ulong)__val;
        uVar15 = 1;
        if (9 < __val) {
          uVar11 = uVar13;
          uVar5 = 4;
          do {
            uVar15 = uVar5;
            uVar7 = (uint)uVar11;
            if (uVar7 < 100) {
              uVar15 = uVar15 - 2;
              goto LAB_0020231f;
            }
            if (uVar7 < 1000) {
              uVar15 = uVar15 - 1;
              goto LAB_0020231f;
            }
            if (uVar7 < 10000) goto LAB_0020231f;
            uVar11 = uVar11 / 10000;
            uVar5 = uVar15 + 4;
          } while (99999 < uVar7);
          uVar15 = uVar15 + 1;
        }
LAB_0020231f:
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct((ulong)local_60,(char)uVar15);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_60[0],uVar15,__val);
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_60,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p)
        ;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_c8.field_2._M_allocated_capacity = *psVar12;
          local_c8.field_2._8_8_ = plVar10[3];
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar12;
          local_c8._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_c8._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&local_d0->_M_t,&local_c8);
        if (iVar8._M_node == p_Var4) {
LAB_002024e7:
          bVar16 = false;
        }
        else {
          uVar15 = 1;
          if (9 < __val) {
            uVar11 = uVar13;
            uVar5 = 4;
            do {
              uVar15 = uVar5;
              uVar7 = (uint)uVar11;
              if (uVar7 < 100) {
                uVar15 = uVar15 - 2;
                goto LAB_00202411;
              }
              if (uVar7 < 1000) {
                uVar15 = uVar15 - 1;
                goto LAB_00202411;
              }
              if (uVar7 < 10000) goto LAB_00202411;
              uVar11 = uVar11 / 10000;
              uVar5 = uVar15 + 4;
            } while (99999 < uVar7);
            uVar15 = uVar15 + 1;
          }
LAB_00202411:
          local_a0[0] = local_90;
          std::__cxx11::string::_M_construct((ulong)local_a0,(char)uVar15);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a0[0],uVar15,__val);
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_a0,0,(char *)0x0,
                                       (ulong)local_f0._M_dataplus._M_p);
          psVar12 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_80.field_2._M_allocated_capacity = *psVar12;
            local_80.field_2._8_8_ = plVar10[3];
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          }
          else {
            local_80.field_2._M_allocated_capacity = *psVar12;
            local_80._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_80._M_string_length = plVar10[1];
          *plVar10 = (long)psVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](local_d0,&local_80);
          sVar2 = pmVar9->_M_string_length;
          bVar16 = true;
          if (sVar2 == rule->_M_string_length) {
            if (sVar2 == 0) goto LAB_002024e7;
            iVar6 = bcmp((pmVar9->_M_dataplus)._M_p,(rule->_M_dataplus)._M_p,sVar2);
            bVar16 = iVar6 != 0;
          }
        }
        if (iVar8._M_node != local_a8) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if (local_a0[0] != local_90) {
            operator_delete(local_a0[0],local_90[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
        __return_storage_ptr__ = local_38;
        uVar15 = __val + 1;
      } while (bVar16);
      uVar15 = 1;
      if (9 < __val) {
        uVar5 = 4;
        do {
          uVar15 = uVar5;
          uVar7 = (uint)uVar13;
          if (uVar7 < 100) {
            uVar15 = uVar15 - 2;
            goto LAB_00202649;
          }
          if (uVar7 < 1000) {
            uVar15 = uVar15 - 1;
            goto LAB_00202649;
          }
          if (uVar7 < 10000) goto LAB_00202649;
          uVar13 = uVar13 / 10000;
          uVar5 = uVar15 + 4;
        } while (99999 < uVar7);
        uVar15 = uVar15 + 1;
      }
LAB_00202649:
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_c8,(char)uVar15);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_c8._M_dataplus._M_p,uVar15,__val);
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_c8,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar12 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar12) {
        lVar3 = plVar10[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar10;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
      }
      __return_storage_ptr__->_M_string_length = plVar10[1];
      *plVar10 = (long)psVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_d0,__return_storage_ptr__);
      std::__cxx11::string::_M_assign((string *)pmVar9);
      goto LAB_00202702;
    }
    if (sVar2 != 0) {
      iVar6 = bcmp((pmVar9->_M_dataplus)._M_p,(rule->_M_dataplus)._M_p,sVar2);
      if (iVar6 != 0) goto LAB_0020229e;
    }
  }
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_d0,&local_f0);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,local_f0.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_f0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,local_f0.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_f0._M_string_length;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)paVar1;
LAB_00202702:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _add_rule(const std::string & name, const std::string & rule) {
        std::string esc_name = regex_replace(name, INVALID_RULE_CHARS_RE, "-");
        if (_rules.find(esc_name) == _rules.end() || _rules[esc_name] == rule) {
            _rules[esc_name] = rule;
            return esc_name;
        } else {
            int i = 0;
            while (_rules.find(esc_name + std::to_string(i)) != _rules.end() && _rules[esc_name + std::to_string(i)] != rule) {
                i++;
            }
            std::string key = esc_name + std::to_string(i);
            _rules[key] = rule;
            return key;
        }
    }